

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::AssertSnapEquiv
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  char16_t *string1;
  char16_t *string2;
  long lVar1;
  SnapHandler *pSVar2;
  TTDVar v1;
  TTDVar v2;
  undefined1 auVar3 [8];
  int iVar4;
  uint uVar5;
  uint uVar6;
  int64 iVar7;
  int64 *piVar8;
  ulong uVar9;
  uint depth;
  ulong uVar10;
  SnapObject *pSVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auStack_98 [8];
  BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  sobj1PidMap;
  int local_54;
  SnapObject *local_50;
  int64 local_48;
  int64 locationTag;
  SnapHandlerPropertyEntry local_38;
  SnapHandlerPropertyEntry spe;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sobj1->SnapObjectTag == sobj2->SnapObjectTag);
  string1 = sobj1->OptWellKnownToken;
  string2 = sobj2->OptWellKnownToken;
  bVar12 = true;
  bVar13 = true;
  locationTag = (int64)sobj1;
  if (string1 != string2) {
    if (string2 == (char16_t *)0x0 || string1 == (char16_t *)0x0) {
      bVar13 = false;
    }
    else {
      iVar4 = PAL_wcscmp(string1,string2);
      bVar13 = iVar4 == 0;
    }
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar13);
  iVar7 = locationTag;
  NSSnapType::AssertSnapEquiv(*(SnapType **)(locationTag + 0x10),sobj2->SnapType,compareMap);
  if (*(uint32 **)(iVar7 + 0x38) != (uint32 *)0x0 || sobj2->OptDependsOnInfo != (DependsOnInfo *)0x0
     ) {
    bVar12 = **(uint32 **)(iVar7 + 0x38) == sobj2->OptDependsOnInfo->DepOnCount;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar12);
  iVar7 = locationTag;
  if (compareMap->StrictCrossSite == true) {
    bVar13 = *(int *)(locationTag + 0x20) == sobj2->IsCrossSite;
  }
  else if (*(int *)(locationTag + 0x20) == 0) {
    bVar13 = true;
  }
  else {
    bVar13 = sobj2->IsCrossSite != 0;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar13);
  bVar13 = Js::DynamicType::Is(*(TypeId *)(*(long *)(iVar7 + 0x10) + 8));
  bVar12 = Js::DynamicType::Is(sobj2->SnapType->JsTypeId);
  pSVar11 = (SnapObject *)locationTag;
  TTDCompareMap::DiagnosticAssert(compareMap,bVar12 == bVar13);
  bVar13 = Js::DynamicType::Is(*(TypeId *)(*(long *)((long)pSVar11 + 0x10) + 8));
  if (bVar13) {
    local_50 = sobj2;
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,*(TTD_PTR_ID *)((long)pSVar11 + 0x30),sobj2->OptIndexedObjectArray,
               L"indexedObjectArray");
    lVar1 = *(long *)(*(long *)((long)pSVar11 + 0x10) + 0x20);
    auStack_98 = (undefined1  [8])0x0;
    sobj1PidMap.buckets = (Type)0x0;
    sobj1PidMap.entries = (Type)&Memory::HeapAllocator::Instance;
    sobj1PidMap.alloc = (Type)0x0;
    sobj1PidMap.size = 0;
    sobj1PidMap.count = 0;
    sobj1PidMap.freeList = 0x4b;
    sobj1PidMap.freeCount = 0;
    sobj1PidMap.modFunctionIndex = 0;
    uVar5 = *(uint *)(lVar1 + 0x10);
    if (uVar5 != 0) {
      uVar10 = 0;
      do {
        local_38 = *(SnapHandlerPropertyEntry *)(*(long *)(lVar1 + 0x18) + uVar10 * 8);
        if (local_38.DataKind != Clear) {
          local_48 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
          local_54 = (int)uVar10;
          JsUtil::
          BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)auStack_98,&local_48,&local_54);
          uVar5 = *(uint *)(lVar1 + 0x10);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar5);
    }
    pSVar2 = local_50->SnapType->TypeHandlerInfo;
    if (pSVar2->MaxPropertyIndex != 0) {
      uVar10 = 0;
      do {
        local_38 = pSVar2->PropertyInfoArray[uVar10];
        if (((ulong)local_38 & 0xfe00000000) != 0) {
          iVar7 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
          auVar3 = auStack_98;
          local_48 = CONCAT44(local_48._4_4_,0xffffffff);
          depth = 0;
          if (auStack_98 != (undefined1  [8])0x0) {
            uVar6 = JsUtil::
                    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::GetBucket((int)iVar7 * 2 + 1,sobj1PidMap.alloc._4_4_,sobj1PidMap.freeList);
            uVar5 = *(uint *)((long)auVar3 + (ulong)uVar6 * 4);
            if (-1 < (int)uVar5) {
              depth = 0;
              do {
                uVar9 = (ulong)uVar5;
                if (*(long *)(sobj1PidMap.buckets + uVar9 * 4 + 2) == iVar7) {
                  if (sobj1PidMap._40_8_ != 0) {
                    DictionaryStats::Lookup((DictionaryStats *)sobj1PidMap._40_8_,depth);
                  }
                  piVar8 = (int64 *)(sobj1PidMap.buckets + uVar9 * 4);
                  goto LAB_0090a9d2;
                }
                depth = depth + 1;
                uVar5 = sobj1PidMap.buckets[uVar9 * 4 + 1];
              } while (-1 < (int)uVar5);
            }
          }
          piVar8 = &local_48;
          if (sobj1PidMap._40_8_ != 0) {
            DictionaryStats::Lookup((DictionaryStats *)sobj1PidMap._40_8_,depth);
            piVar8 = &local_48;
          }
LAB_0090a9d2:
          iVar7 = *piVar8;
          TTDCompareMap::DiagnosticAssert(compareMap,(long)(int)iVar7 != -1);
          v1 = *(TTDVar *)(*(long *)(locationTag + 0x28) + (long)(int)iVar7 * 8);
          v2 = local_50->VarArray[uVar10];
          if (local_38.DataKind == Setter) {
            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter
                      (v1,v2,compareMap,local_38.PropertyRecordId);
          }
          else if (local_38.DataKind == Getter) {
            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter
                      (v1,v2,compareMap,local_38.PropertyRecordId);
          }
          else {
            if (local_38.DataKind != Data) {
              TTDAbort_unrecoverable_error("What other tags are there???");
            }
            NSSnapValues::AssertSnapEquivTTDVar_Property(v1,v2,compareMap,local_38.PropertyRecordId)
            ;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < pSVar2->MaxPropertyIndex);
    }
    JsUtil::
    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_98);
    pSVar11 = (SnapObject *)locationTag;
    sobj2 = local_50;
  }
  if (compareMap->SnapObjCmpVTable[(int)pSVar11->SnapObjectTag] !=
      (fPtr_AssertSnapEquivAddtlInfo)0x0) {
    (*compareMap->SnapObjCmpVTable[(int)pSVar11->SnapObjectTag])(pSVar11,sobj2,compareMap);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sobj1->SnapObjectTag == sobj2->SnapObjectTag);
            compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(sobj1->OptWellKnownToken, sobj2->OptWellKnownToken));

            NSSnapType::AssertSnapEquiv(sobj1->SnapType, sobj2->SnapType, compareMap);

            //Depends on info is a function of the rest of the properties so we don't need to explicitly check it.
            //But for sanity assert same counts.
            compareMap.DiagnosticAssert((sobj1->OptDependsOnInfo == nullptr && sobj2->OptDependsOnInfo == nullptr) || (sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount));

            //we allow the replay in debug mode to be cross site even if orig was not (that is ok) but if record was x-site then replay must be as well
            if(compareMap.StrictCrossSite)
            {
                compareMap.DiagnosticAssert(sobj1->IsCrossSite == sobj2->IsCrossSite);
            }
            else
            {
                compareMap.DiagnosticAssert(!sobj1->IsCrossSite || sobj2->IsCrossSite);
            }

#if ENABLE_OBJECT_SOURCE_TRACKING
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.SourceLine == sobj2->DiagOriginInfo.SourceLine);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.EventTime == sobj2->DiagOriginInfo.EventTime);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.TimeHash == sobj2->DiagOriginInfo.TimeHash);
#endif

            compareMap.DiagnosticAssert(Js::DynamicType::Is(sobj1->SnapType->JsTypeId) == Js::DynamicType::Is(sobj2->SnapType->JsTypeId));
            if(Js::DynamicType::Is(sobj1->SnapType->JsTypeId))
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Special(sobj1->OptIndexedObjectArray, sobj2->OptIndexedObjectArray, _u("indexedObjectArray"));

                const NSSnapType::SnapHandler* handler1 = sobj1->SnapType->TypeHandlerInfo;
                JsUtil::BaseDictionary<int64, int32, HeapAllocator> sobj1PidMap(&HeapAllocator::Instance);
                for(uint32 i = 0; i < handler1->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler1->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);
                        sobj1PidMap.AddNew(locationTag, (int32)i);
                    }
                }

                const NSSnapType::SnapHandler* handler2 = sobj2->SnapType->TypeHandlerInfo;
                for(uint32 i = 0; i < handler2->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler2->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear && spe.DataKind != NSSnapType::SnapEntryDataKindTag::Uninitialized)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);

                        int32 idx1 = sobj1PidMap.LookupWithKey(locationTag, -1);
                        compareMap.DiagnosticAssert(idx1 != -1);

                        TTDVar var1 = sobj1->VarArray[idx1];
                        TTDVar var2 = sobj2->VarArray[i];

                        if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_Property(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else
                        {
                            TTDAssert(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Setter, "What other tags are there???");

                            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                    }
                }
            }

            fPtr_AssertSnapEquivAddtlInfo equivCheck = compareMap.SnapObjCmpVTable[(int32)sobj1->SnapObjectTag];
            if(equivCheck != nullptr)
            {
                equivCheck(sobj1, sobj2, compareMap);
            }
        }